

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_cache_utils.c
# Opt level: O0

int VP8LColorCacheInit(VP8LColorCache *color_cache,int hash_bits)

{
  void *pvVar1;
  int in_ESI;
  long *in_RDI;
  int hash_size;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pvVar1 = WebPSafeCalloc(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (size_t)in_RDI);
  *in_RDI = (long)pvVar1;
  if (*in_RDI != 0) {
    *(int *)(in_RDI + 1) = 0x20 - in_ESI;
    *(int *)((long)in_RDI + 0xc) = in_ESI;
  }
  return (uint)(*in_RDI != 0);
}

Assistant:

int VP8LColorCacheInit(VP8LColorCache* const color_cache, int hash_bits) {
  const int hash_size = 1 << hash_bits;
  assert(color_cache != NULL);
  assert(hash_bits > 0);
  color_cache->colors = (uint32_t*)WebPSafeCalloc(
      (uint64_t)hash_size, sizeof(*color_cache->colors));
  if (color_cache->colors == NULL) return 0;
  color_cache->hash_shift = 32 - hash_bits;
  color_cache->hash_bits = hash_bits;
  return 1;
}